

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O0

SymbolPair * __thiscall
sentencepiece::model::FreeList<SymbolPair>::Allocate(FreeList<SymbolPair> *this)

{
  size_type sVar1;
  value_type pSVar2;
  long lVar3;
  undefined1 auVar4 [16];
  size_type sVar5;
  ulong uVar6;
  vector<SymbolPair_*,_std::allocator<SymbolPair_*>_> *this_00;
  reference ppSVar7;
  long in_RDI;
  SymbolPair *result;
  SymbolPair *chunk;
  value_type *in_stack_ffffffffffffffe8;
  
  if (*(ulong *)(in_RDI + 0x30) <= *(ulong *)(in_RDI + 0x20)) {
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  sVar1 = *(size_type *)(in_RDI + 0x28);
  sVar5 = std::vector<SymbolPair_*,_std::allocator<SymbolPair_*>_>::size
                    ((vector<SymbolPair_*,_std::allocator<SymbolPair_*>_> *)(in_RDI + 8));
  if (sVar1 == sVar5) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(in_RDI + 0x30);
    uVar6 = SUB168(auVar4 * ZEXT816(0x18),0);
    if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    this_00 = (vector<SymbolPair_*,_std::allocator<SymbolPair_*>_> *)operator_new__(uVar6);
    memset(this_00,0,*(long *)(in_RDI + 0x30) * 0x18);
    std::vector<SymbolPair_*,_std::allocator<SymbolPair_*>_>::push_back
              (this_00,in_stack_ffffffffffffffe8);
  }
  ppSVar7 = std::vector<SymbolPair_*,_std::allocator<SymbolPair_*>_>::operator[]
                      ((vector<SymbolPair_*,_std::allocator<SymbolPair_*>_> *)(in_RDI + 8),
                       *(size_type *)(in_RDI + 0x28));
  pSVar2 = *ppSVar7;
  lVar3 = *(long *)(in_RDI + 0x20);
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
  return pSVar2 + lVar3;
}

Assistant:

T* Allocate() {
    if (element_index_ >= chunk_size_) {
      ++chunk_index_;
      element_index_ = 0;
    }

    if (chunk_index_ == freelist_.size()) {
      T* chunk = new T[chunk_size_];
      memset(static_cast<void*>(chunk), 0, sizeof(*chunk) * chunk_size_);
      freelist_.push_back(chunk);
    }

    T* result = freelist_[chunk_index_] + element_index_;
    ++element_index_;

    return result;
  }